

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O3

int CfdAddTapBranchByTapLeaf(void *handle,void *tree_handle,char *tapscript,uint8_t leaf_version)

{
  Script *pSVar1;
  TapBranch *this;
  TaprootScriptTree *this_00;
  bool bVar2;
  CfdException *this_01;
  TaprootScriptTree leaf;
  allocator local_119;
  string local_118;
  TaprootScriptTree local_f8;
  Script local_68;
  
  cfd::Initialize();
  pSVar1 = &local_f8.super_TapBranch.script_;
  local_f8.super_TapBranch._vptr_TapBranch = (_func_int **)pSVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"TapscriptTree","");
  cfd::capi::CheckBuffer(tree_handle,(string *)&local_f8);
  if ((Script *)local_f8.super_TapBranch._vptr_TapBranch != pSVar1) {
    operator_delete(local_f8.super_TapBranch._vptr_TapBranch);
  }
  bVar2 = cfd::capi::IsEmptyString(tapscript);
  if (!bVar2) {
    std::__cxx11::string::string((string *)&local_118,tapscript,&local_119);
    cfd::core::Script::Script(&local_68,&local_118);
    cfd::core::TaprootScriptTree::TaprootScriptTree(&local_f8,leaf_version,&local_68);
    cfd::core::Script::~Script(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    this = (TapBranch *)**(undefined8 **)((long)tree_handle + 0x18);
    if (this == (TapBranch *)(*(undefined8 **)((long)tree_handle + 0x18))[1]) {
      this_00 = (TaprootScriptTree *)**(undefined8 **)((long)tree_handle + 0x10);
      if ((TaprootScriptTree *)(*(undefined8 **)((long)tree_handle + 0x10))[1] == this_00) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
      }
      cfd::core::TaprootScriptTree::AddBranch(this_00,&local_f8);
    }
    else {
      cfd::core::TapBranch::ToString_abi_cxx11_((string *)&local_68,this);
      if (local_68._vptr_Script !=
          (_func_int **)
          ((long)&local_68.script_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + 8U)) {
        operator_delete(local_68._vptr_Script);
      }
      if (local_68.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        cfd::core::TapBranch::operator=(this,&local_f8.super_TapBranch);
      }
      else {
        cfd::core::TapBranch::AddBranch(this,&local_f8.super_TapBranch);
      }
    }
    local_f8.super_TapBranch._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_f8.nodes_);
    cfd::core::TapBranch::~TapBranch(&local_f8.super_TapBranch);
    return 0;
  }
  local_f8.super_TapBranch._vptr_TapBranch = (_func_int **)0x5e1390;
  local_f8.super_TapBranch.has_leaf_ = true;
  local_f8.super_TapBranch.leaf_version_ = '\x03';
  local_f8.super_TapBranch._10_2_ = 0;
  local_f8.super_TapBranch.script_._vptr_Script = (_func_int **)0x5e1853;
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_f8,kCfdLogLevelWarning,"tapscript is null or empty.");
  this_01 = (CfdException *)__cxa_allocate_exception(0x30);
  local_f8.super_TapBranch._vptr_TapBranch = (_func_int **)pSVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"Failed to parameter. tapscript is null or empty.","");
  cfd::core::CfdException::CfdException(this_01,kCfdIllegalArgumentError,(string *)&local_f8);
  __cxa_throw(this_01,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddTapBranchByTapLeaf(
    void* handle, void* tree_handle, const char* tapscript,
    uint8_t leaf_version) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    if (IsEmptyString(tapscript)) {
      warn(CFD_LOG_SOURCE, "tapscript is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tapscript is null or empty.");
    }
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    TaprootScriptTree leaf(leaf_version, Script(tapscript));
    if (!buffer->branch_buffer->empty()) {
      auto& branch = buffer->branch_buffer->at(0);
      if (branch.ToString().empty()) {
        branch = leaf;  // override
      } else {
        branch.AddBranch(leaf);
      }
    } else {
      auto& tree = buffer->tree_buffer->at(0);
      tree.AddBranch(leaf);
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}